

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O3

void duckdb::Node7Leaf::ShrinkNode15Leaf(ART *art,Node *node7_leaf,Node *node15_leaf)

{
  byte *pbVar1;
  uint8_t uVar2;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var3;
  idx_t iVar4;
  BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8> *pBVar5;
  type paVar6;
  iterator iVar7;
  pointer this;
  data_ptr_t pdVar8;
  ulong uVar9;
  long lVar10;
  ulong local_38;
  
  pBVar5 = BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::New(art,node7_leaf);
  uVar9 = (node15_leaf->super_IndexPointer).data;
  paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var3._M_head_impl =
       paVar6->_M_elems[7].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_38 = uVar9 & 0xffffffff;
  iVar7 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var3._M_head_impl)->buffers)._M_h,&local_38);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar8 = FixedSizeBuffer::Get(this,true);
  lVar10 = (ulong)((uint)(uVar9 >> 0x20) & 0xffffff) * (_Var3._M_head_impl)->segment_size;
  iVar4 = (_Var3._M_head_impl)->bitmask_offset;
  pbVar1 = pdVar8 + iVar4 + lVar10;
  (node7_leaf->super_IndexPointer).data =
       (node15_leaf->super_IndexPointer).data & 0x8000000000000000 |
       (node7_leaf->super_IndexPointer).data & 0x7fffffffffffffff;
  uVar2 = pdVar8[iVar4 + lVar10];
  pBVar5->count = uVar2;
  if (uVar2 != '\0') {
    uVar9 = 0;
    do {
      pBVar5->key[uVar9] = pbVar1[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (uVar9 < *pbVar1);
  }
  *pbVar1 = 0;
  Node::Free(art,node15_leaf);
  return;
}

Assistant:

void Node7Leaf::ShrinkNode15Leaf(ART &art, Node &node7_leaf, Node &node15_leaf) {
	auto &n7 = New(art, node7_leaf);
	auto &n15 = Node::Ref<Node15Leaf>(art, node15_leaf, NType::NODE_15_LEAF);
	node7_leaf.SetGateStatus(node15_leaf.GetGateStatus());

	n7.count = n15.count;
	for (uint8_t i = 0; i < n15.count; i++) {
		n7.key[i] = n15.key[i];
	}

	n15.count = 0;
	Node::Free(art, node15_leaf);
}